

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O2

void __thiscall
writer_test_should_write_float_field_Test::TestBody(writer_test_should_write_float_field_Test *this)

{
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  char *pcVar1;
  ostringstream local_1d8 [8];
  ostringstream oss;
  undefined8 local_60;
  undefined1 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  internal local_30 [8];
  AssertionResult gtest_ar;
  
  local_60 = 0x403159999999999a;
  local_58 = 0;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>_>::write
            ((int)local_1d8,&local_60,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            (local_30,"oss.str()","\"44=17.35|\"",&local_50,(char (*) [10])"44=17.35|");
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_50);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_60 = 0x4132d68773333333;
    local_58 = 0;
    pcVar1 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)local_30);
    std::__cxx11::stringbuf::str((string *)&oss);
    std::__cxx11::string::~string((string *)&local_50);
    Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>_>::write
              ((int)local_1d8,&local_60,__n_00);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[15]>
              (local_30,"oss.str()","\"44=1234567.45|\"",&local_50,(char (*) [15])"44=1234567.45|");
    std::__cxx11::string::~string((string *)&local_50);
    if (local_30[0] != (internal)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_60 = 0x412e848000000000;
      local_58 = 0;
      pcVar1 = "";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"",(allocator<char> *)local_30);
      std::__cxx11::stringbuf::str((string *)&oss);
      std::__cxx11::string::~string((string *)&local_50);
      Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>_>::write
                ((int)local_1d8,&local_60,__n_01);
      std::__cxx11::stringbuf::str();
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
                (local_30,"oss.str()","\"44=1000000|\"",&local_50,(char (*) [12])"44=1000000|");
      std::__cxx11::string::~string((string *)&local_50);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (gtest_ar._0_8_ != 0) {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                   ,0x77,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_50);
      }
      goto LAB_00186b5a;
    }
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ != 0) {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x70,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_50);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_50);
LAB_00186b5a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return;
}

Assistant:

TEST(writer_test, should_write_float_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::Price>;
    Field field;

    field.set(17.35);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=17.35|");

    field.set(1234567.45);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1234567.45|");

    field.set(1000000.0);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1000000|");
}